

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionBegStr.cpp
# Opt level: O3

void __thiscall
Hpipe::InstructionBegStr::write_cpp
          (InstructionBegStr *this,StreamSepMaker *ss,StreamSepMaker *es,CppEmitter *cpp_emitter)

{
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"data","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"buf","");
  (*(this->super_InstructionWithCode).super_Instruction._vptr_Instruction[0x14])
            (this,ss,es,cpp_emitter,local_50,local_70);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  Instruction::write_trans((Instruction *)this,ss,cpp_emitter,0);
  return;
}

Assistant:

void InstructionBegStr::write_cpp( StreamSepMaker &ss, StreamSepMaker &es, CppEmitter *cpp_emitter ) {
    write_cpp_code_seq( ss, es, cpp_emitter );
    write_trans( ss, cpp_emitter );
}